

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayGet(FunctionValidator *this,ArrayGet *curr)

{
  bool bVar1;
  bool bVar2;
  Module *pMVar3;
  BasicType local_74;
  HeapType local_70 [2];
  Type *local_60;
  Field *element;
  HeapType local_50;
  HeapType heapType;
  Type local_40;
  Type local_38;
  BasicType local_2c;
  Type local_28;
  Type local_20;
  ArrayGet *local_18;
  ArrayGet *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayGet *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar3->features);
  shouldBeTrue<wasm::ArrayGet*>(this,bVar1,local_18,"array.get requires gc [--enable-gc]");
  local_20.id = (local_18->index->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayGet*,wasm::Type>
            (this,local_20,local_28,local_18,"array.get index must be an i32");
  local_2c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)66>).
                      super_Expression.type,&local_2c);
  if (!bVar1) {
    local_38.id = (local_18->ref->type).id;
    HeapType::HeapType(&heapType,array);
    wasm::Type::Type(&local_40,heapType,Nullable);
    bVar1 = shouldBeSubType(this,local_38,local_40,(Expression *)local_18,
                            "array.get target should be an array reference");
    if (bVar1) {
      local_50 = wasm::Type::getHeapType(&local_18->ref->type);
      element._4_4_ = 0xb;
      bVar1 = HeapType::operator==(&local_50,(BasicHeapType *)((long)&element + 4));
      if (!bVar1) {
        element._0_4_ = 6;
        bVar1 = HeapType::operator!=(&local_50,(BasicHeapType *)&element);
        bVar1 = shouldBeTrue<wasm::ArrayGet*>
                          (this,bVar1,local_18,
                           "array.get target should be a specific array reference");
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          HeapType::getArray(local_70);
          local_60 = (Type *)local_70;
          local_74 = i32;
          bVar2 = wasm::Type::operator!=(local_60,&local_74);
          bVar1 = true;
          if (!bVar2) {
            bVar1 = (int)local_60[1].id == 0;
          }
          if (bVar1) {
            shouldBeFalse<wasm::ArrayGet*>
                      (this,(bool)(local_18->signed_ & 1),local_18,"non-packed get cannot be signed"
                      );
          }
          shouldBeEqual<wasm::ArrayGet*,wasm::Type>
                    (this,(Type)(local_18->super_SpecificExpression<(wasm::Expression::Id)66>).
                                super_Expression.type.id,(Type)local_60->id,local_18,
                     "array.get must have the proper type");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayGet(ArrayGet* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.get requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->index->type, Type(Type::i32), curr, "array.get index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.get target should be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(heapType != HeapType::array,
                    curr,
                    "array.get target should be a specific array reference")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  // If the type is not packed, it must be marked internally as unsigned, by
  // convention.
  if (element.type != Type::i32 || element.packedType == Field::not_packed) {
    shouldBeFalse(curr->signed_, curr, "non-packed get cannot be signed");
  }
  shouldBeEqual(
    curr->type, element.type, curr, "array.get must have the proper type");
}